

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructSerializer.hpp
# Opt level: O0

void mserialize::
     StructSerializer<binlog::EventSource,_std::integral_constant<unsigned_long_binlog::EventSource::*,_&binlog::EventSource::id>,_std::integral_constant<binlog::Severity_binlog::EventSource::*,_&binlog::EventSource::severity>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::category>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::function>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::file>,_std::integral_constant<unsigned_long_binlog::EventSource::*,_&binlog::EventSource::line>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::formatString>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::argumentTags>_>
     ::serialize<binlog::detail::RecoverableVectorOutputStream>
               (EventSource *t,RecoverableVectorOutputStream *ostream)

{
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar2;
  uint in_stack_ffffffffffffffd4;
  undefined4 uVar3;
  
  uVar1 = 1;
  StructSerializer<binlog::EventSource,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::id>,std::integral_constant<binlog::Severity_binlog::EventSource::*,&binlog::EventSource::severity>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::category>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::function>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::file>,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::line>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::formatString>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::argumentTags>>
  ::
  serialize_member<binlog::EventSource,unsigned_long,binlog::detail::RecoverableVectorOutputStream>
            ((EventSource *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             CONCAT44(1,in_stack_ffffffffffffffc8),(RecoverableVectorOutputStream *)0x108ca9);
  uVar2 = 0;
  StructSerializer<binlog::EventSource,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::id>,std::integral_constant<binlog::Severity_binlog::EventSource::*,&binlog::EventSource::severity>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::category>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::function>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::file>,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::line>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::formatString>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::argumentTags>>
  ::
  serialize_member<binlog::EventSource,binlog::Severity,binlog::detail::RecoverableVectorOutputStream>
            ((EventSource *)((ulong)in_stack_ffffffffffffffd4 << 0x20),
             CONCAT44(uVar1,in_stack_ffffffffffffffc8),(RecoverableVectorOutputStream *)0x108cc5);
  uVar3 = 0;
  StructSerializer<binlog::EventSource,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::id>,std::integral_constant<binlog::Severity_binlog::EventSource::*,&binlog::EventSource::severity>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::category>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::function>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::file>,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::line>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::formatString>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::argumentTags>>
  ::
  serialize_member<binlog::EventSource,std::__cxx11::string,binlog::detail::RecoverableVectorOutputStream>
            ((EventSource *)(ulong)uVar2,CONCAT44(uVar1,in_stack_ffffffffffffffc8),
             (RecoverableVectorOutputStream *)0x108ce1);
  StructSerializer<binlog::EventSource,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::id>,std::integral_constant<binlog::Severity_binlog::EventSource::*,&binlog::EventSource::severity>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::category>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::function>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::file>,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::line>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::formatString>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::argumentTags>>
  ::
  serialize_member<binlog::EventSource,std::__cxx11::string,binlog::detail::RecoverableVectorOutputStream>
            ((EventSource *)CONCAT44(uVar3,uVar2),CONCAT44(uVar1,in_stack_ffffffffffffffc8),
             (RecoverableVectorOutputStream *)0x108cfd);
  StructSerializer<binlog::EventSource,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::id>,std::integral_constant<binlog::Severity_binlog::EventSource::*,&binlog::EventSource::severity>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::category>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::function>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::file>,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::line>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::formatString>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::argumentTags>>
  ::
  serialize_member<binlog::EventSource,std::__cxx11::string,binlog::detail::RecoverableVectorOutputStream>
            ((EventSource *)CONCAT44(uVar3,uVar2),CONCAT44(uVar1,in_stack_ffffffffffffffc8),
             (RecoverableVectorOutputStream *)0x108d19);
  StructSerializer<binlog::EventSource,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::id>,std::integral_constant<binlog::Severity_binlog::EventSource::*,&binlog::EventSource::severity>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::category>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::function>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::file>,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::line>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::formatString>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::argumentTags>>
  ::
  serialize_member<binlog::EventSource,unsigned_long,binlog::detail::RecoverableVectorOutputStream>
            ((EventSource *)CONCAT44(uVar3,uVar2),CONCAT44(uVar1,in_stack_ffffffffffffffc8),
             (RecoverableVectorOutputStream *)0x108d35);
  StructSerializer<binlog::EventSource,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::id>,std::integral_constant<binlog::Severity_binlog::EventSource::*,&binlog::EventSource::severity>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::category>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::function>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::file>,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::line>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::formatString>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::argumentTags>>
  ::
  serialize_member<binlog::EventSource,std::__cxx11::string,binlog::detail::RecoverableVectorOutputStream>
            ((EventSource *)CONCAT44(uVar3,uVar2),CONCAT44(uVar1,in_stack_ffffffffffffffc8),
             (RecoverableVectorOutputStream *)0x108d51);
  StructSerializer<binlog::EventSource,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::id>,std::integral_constant<binlog::Severity_binlog::EventSource::*,&binlog::EventSource::severity>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::category>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::function>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::file>,std::integral_constant<unsigned_long_binlog::EventSource::*,&binlog::EventSource::line>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::formatString>,std::integral_constant<std::__cxx11::string_binlog::EventSource::*,&binlog::EventSource::argumentTags>>
  ::
  serialize_member<binlog::EventSource,std::__cxx11::string,binlog::detail::RecoverableVectorOutputStream>
            ((EventSource *)CONCAT44(uVar3,uVar2),CONCAT44(uVar1,in_stack_ffffffffffffffc8),
             (RecoverableVectorOutputStream *)0x108d6d);
  return;
}

Assistant:

static void serialize(const T& t, OutputStream& ostream)
  {
    using swallow = int[];
    (void)swallow{1, (serialize_member(t, Members::value, ostream), int{})...};
  }